

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__resample_row_generic(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  stbi_uc sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  stbi_uc *psVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar44;
  int iVar53;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar54;
  int iVar58;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  long lVar20;
  
  auVar11 = _DAT_00132150;
  if (0 < w) {
    lVar20 = (ulong)(uint)hs - 1;
    auVar15._8_4_ = (int)lVar20;
    auVar15._0_8_ = lVar20;
    auVar15._12_4_ = (int)((ulong)lVar20 >> 0x20);
    psVar13 = out + 0xf;
    uVar14 = 0;
    do {
      if (0 < hs) {
        sVar1 = in_near[uVar14];
        uVar12 = 0;
        auVar19 = _DAT_001320d0;
        auVar21 = _DAT_001320e0;
        auVar22 = _DAT_001320f0;
        auVar23 = _DAT_00132100;
        auVar61 = _DAT_00132140;
        auVar62 = _DAT_00132130;
        auVar63 = _DAT_00132120;
        auVar64 = _DAT_00132110;
        do {
          auVar16 = auVar15 ^ auVar11;
          auVar31 = auVar61 ^ auVar11;
          iVar44 = auVar16._0_4_;
          iVar54 = -(uint)(iVar44 < auVar31._0_4_);
          iVar30 = auVar16._4_4_;
          auVar32._4_4_ = -(uint)(iVar30 < auVar31._4_4_);
          iVar53 = auVar16._8_4_;
          iVar58 = -(uint)(iVar53 < auVar31._8_4_);
          iVar18 = auVar16._12_4_;
          auVar32._12_4_ = -(uint)(iVar18 < auVar31._12_4_);
          auVar45._4_4_ = iVar54;
          auVar45._0_4_ = iVar54;
          auVar45._8_4_ = iVar58;
          auVar45._12_4_ = iVar58;
          auVar24 = pshuflw(in_XMM5,auVar45,0xe8);
          auVar34._4_4_ = -(uint)(auVar31._4_4_ == iVar30);
          auVar34._12_4_ = -(uint)(auVar31._12_4_ == iVar18);
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          auVar59 = pshuflw(in_XMM11,auVar34,0xe8);
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar31 = pshuflw(auVar24,auVar32,0xe8);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar16 = (auVar31 | auVar59 & auVar24) ^ auVar16;
          auVar16 = packssdw(auVar16,auVar16);
          if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            psVar13[uVar12 - 0xf] = sVar1;
          }
          auVar32 = auVar34 & auVar45 | auVar32;
          auVar16 = packssdw(auVar32,auVar32);
          auVar31._8_4_ = 0xffffffff;
          auVar31._0_8_ = 0xffffffffffffffff;
          auVar31._12_4_ = 0xffffffff;
          auVar16 = packssdw(auVar16 ^ auVar31,auVar16 ^ auVar31);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16._0_4_ >> 8 & 1) != 0) {
            psVar13[uVar12 - 0xe] = sVar1;
          }
          auVar16 = auVar62 ^ auVar11;
          iVar54 = -(uint)(iVar44 < auVar16._0_4_);
          auVar55._4_4_ = -(uint)(iVar30 < auVar16._4_4_);
          iVar58 = -(uint)(iVar53 < auVar16._8_4_);
          auVar55._12_4_ = -(uint)(iVar18 < auVar16._12_4_);
          auVar33._4_4_ = iVar54;
          auVar33._0_4_ = iVar54;
          auVar33._8_4_ = iVar58;
          auVar33._12_4_ = iVar58;
          iVar54 = -(uint)(auVar16._4_4_ == iVar30);
          iVar58 = -(uint)(auVar16._12_4_ == iVar18);
          auVar46._4_4_ = iVar54;
          auVar46._0_4_ = iVar54;
          auVar46._8_4_ = iVar58;
          auVar46._12_4_ = iVar58;
          auVar55._0_4_ = auVar55._4_4_;
          auVar55._8_4_ = auVar55._12_4_;
          auVar16 = auVar46 & auVar33 | auVar55;
          auVar16 = packssdw(auVar16,auVar16);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar16 = packssdw(auVar16 ^ auVar2,auVar16 ^ auVar2);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16._0_4_ >> 0x10 & 1) != 0) {
            psVar13[uVar12 - 0xd] = sVar1;
          }
          auVar16 = pshufhw(auVar16,auVar33,0x84);
          auVar34 = pshufhw(auVar33,auVar46,0x84);
          auVar31 = pshufhw(auVar16,auVar55,0x84);
          auVar25._8_4_ = 0xffffffff;
          auVar25._0_8_ = 0xffffffffffffffff;
          auVar25._12_4_ = 0xffffffff;
          auVar25 = (auVar31 | auVar34 & auVar16) ^ auVar25;
          auVar16 = packssdw(auVar25,auVar25);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16._0_4_ >> 0x18 & 1) != 0) {
            psVar13[uVar12 - 0xc] = sVar1;
          }
          auVar16 = auVar63 ^ auVar11;
          iVar54 = -(uint)(iVar44 < auVar16._0_4_);
          auVar36._4_4_ = -(uint)(iVar30 < auVar16._4_4_);
          iVar58 = -(uint)(iVar53 < auVar16._8_4_);
          auVar36._12_4_ = -(uint)(iVar18 < auVar16._12_4_);
          auVar47._4_4_ = iVar54;
          auVar47._0_4_ = iVar54;
          auVar47._8_4_ = iVar58;
          auVar47._12_4_ = iVar58;
          auVar31 = pshuflw(auVar59 & auVar24,auVar47,0xe8);
          auVar59._0_4_ = -(uint)(auVar16._0_4_ == iVar44);
          auVar59._4_4_ = -(uint)(auVar16._4_4_ == iVar30);
          auVar59._8_4_ = -(uint)(auVar16._8_4_ == iVar53);
          auVar59._12_4_ = -(uint)(auVar16._12_4_ == iVar18);
          auVar35._4_4_ = auVar59._4_4_;
          auVar35._0_4_ = auVar59._4_4_;
          auVar35._8_4_ = auVar59._12_4_;
          auVar35._12_4_ = auVar59._12_4_;
          auVar16 = pshuflw(auVar59,auVar35,0xe8);
          auVar36._0_4_ = auVar36._4_4_;
          auVar36._8_4_ = auVar36._12_4_;
          auVar34 = pshuflw(auVar31,auVar36,0xe8);
          auVar24._8_4_ = 0xffffffff;
          auVar24._0_8_ = 0xffffffffffffffff;
          auVar24._12_4_ = 0xffffffff;
          auVar24 = (auVar34 | auVar16 & auVar31) ^ auVar24;
          auVar16 = packssdw(auVar16 & auVar31,auVar24);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            psVar13[uVar12 - 0xb] = sVar1;
          }
          auVar36 = auVar35 & auVar47 | auVar36;
          auVar31 = packssdw(auVar36,auVar36);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar16 = packssdw(auVar16,auVar31 ^ auVar3);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16._4_2_ >> 8 & 1) != 0) {
            psVar13[uVar12 - 10] = sVar1;
          }
          auVar16 = auVar64 ^ auVar11;
          iVar54 = -(uint)(iVar44 < auVar16._0_4_);
          auVar56._4_4_ = -(uint)(iVar30 < auVar16._4_4_);
          iVar58 = -(uint)(iVar53 < auVar16._8_4_);
          auVar56._12_4_ = -(uint)(iVar18 < auVar16._12_4_);
          auVar37._4_4_ = iVar54;
          auVar37._0_4_ = iVar54;
          auVar37._8_4_ = iVar58;
          auVar37._12_4_ = iVar58;
          iVar54 = -(uint)(auVar16._4_4_ == iVar30);
          iVar58 = -(uint)(auVar16._12_4_ == iVar18);
          auVar48._4_4_ = iVar54;
          auVar48._0_4_ = iVar54;
          auVar48._8_4_ = iVar58;
          auVar48._12_4_ = iVar58;
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar16 = auVar48 & auVar37 | auVar56;
          auVar16 = packssdw(auVar16,auVar16);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar16 = packssdw(auVar16 ^ auVar4,auVar16 ^ auVar4);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            psVar13[uVar12 - 9] = sVar1;
          }
          auVar16 = pshufhw(auVar16,auVar37,0x84);
          auVar34 = pshufhw(auVar37,auVar48,0x84);
          auVar31 = pshufhw(auVar16,auVar56,0x84);
          auVar26._8_4_ = 0xffffffff;
          auVar26._0_8_ = 0xffffffffffffffff;
          auVar26._12_4_ = 0xffffffff;
          auVar26 = (auVar31 | auVar34 & auVar16) ^ auVar26;
          auVar16 = packssdw(auVar26,auVar26);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16._6_2_ >> 8 & 1) != 0) {
            psVar13[uVar12 - 8] = sVar1;
          }
          auVar16 = auVar23 ^ auVar11;
          iVar54 = -(uint)(iVar44 < auVar16._0_4_);
          auVar39._4_4_ = -(uint)(iVar30 < auVar16._4_4_);
          iVar58 = -(uint)(iVar53 < auVar16._8_4_);
          auVar39._12_4_ = -(uint)(iVar18 < auVar16._12_4_);
          auVar49._4_4_ = iVar54;
          auVar49._0_4_ = iVar54;
          auVar49._8_4_ = iVar58;
          auVar49._12_4_ = iVar58;
          auVar24 = pshuflw(auVar24,auVar49,0xe8);
          auVar27._0_4_ = -(uint)(auVar16._0_4_ == iVar44);
          auVar27._4_4_ = -(uint)(auVar16._4_4_ == iVar30);
          auVar27._8_4_ = -(uint)(auVar16._8_4_ == iVar53);
          auVar27._12_4_ = -(uint)(auVar16._12_4_ == iVar18);
          auVar38._4_4_ = auVar27._4_4_;
          auVar38._0_4_ = auVar27._4_4_;
          auVar38._8_4_ = auVar27._12_4_;
          auVar38._12_4_ = auVar27._12_4_;
          auVar16 = pshuflw(auVar27,auVar38,0xe8);
          auVar39._0_4_ = auVar39._4_4_;
          auVar39._8_4_ = auVar39._12_4_;
          auVar31 = pshuflw(auVar24,auVar39,0xe8);
          auVar60._8_4_ = 0xffffffff;
          auVar60._0_8_ = 0xffffffffffffffff;
          auVar60._12_4_ = 0xffffffff;
          auVar60 = (auVar31 | auVar16 & auVar24) ^ auVar60;
          auVar31 = packssdw(auVar60,auVar60);
          auVar16 = packsswb(auVar16 & auVar24,auVar31);
          if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            psVar13[uVar12 - 7] = sVar1;
          }
          auVar39 = auVar38 & auVar49 | auVar39;
          auVar24 = packssdw(auVar39,auVar39);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar24 = packssdw(auVar24 ^ auVar5,auVar24 ^ auVar5);
          auVar16 = packsswb(auVar16,auVar24);
          if ((auVar16._8_2_ >> 8 & 1) != 0) {
            psVar13[uVar12 - 6] = sVar1;
          }
          auVar16 = auVar22 ^ auVar11;
          iVar54 = -(uint)(iVar44 < auVar16._0_4_);
          auVar57._4_4_ = -(uint)(iVar30 < auVar16._4_4_);
          iVar58 = -(uint)(iVar53 < auVar16._8_4_);
          auVar57._12_4_ = -(uint)(iVar18 < auVar16._12_4_);
          auVar40._4_4_ = iVar54;
          auVar40._0_4_ = iVar54;
          auVar40._8_4_ = iVar58;
          auVar40._12_4_ = iVar58;
          iVar54 = -(uint)(auVar16._4_4_ == iVar30);
          iVar58 = -(uint)(auVar16._12_4_ == iVar18);
          auVar50._4_4_ = iVar54;
          auVar50._0_4_ = iVar54;
          auVar50._8_4_ = iVar58;
          auVar50._12_4_ = iVar58;
          auVar57._0_4_ = auVar57._4_4_;
          auVar57._8_4_ = auVar57._12_4_;
          auVar16 = auVar50 & auVar40 | auVar57;
          auVar16 = packssdw(auVar16,auVar16);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar16 = packssdw(auVar16 ^ auVar6,auVar16 ^ auVar6);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            psVar13[uVar12 - 5] = sVar1;
          }
          auVar16 = pshufhw(auVar16,auVar40,0x84);
          auVar34 = pshufhw(auVar40,auVar50,0x84);
          auVar24 = pshufhw(auVar16,auVar57,0x84);
          auVar28._8_4_ = 0xffffffff;
          auVar28._0_8_ = 0xffffffffffffffff;
          auVar28._12_4_ = 0xffffffff;
          auVar28 = (auVar24 | auVar34 & auVar16) ^ auVar28;
          auVar16 = packssdw(auVar28,auVar28);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16._10_2_ >> 8 & 1) != 0) {
            psVar13[uVar12 - 4] = sVar1;
          }
          auVar16 = auVar21 ^ auVar11;
          iVar54 = -(uint)(iVar44 < auVar16._0_4_);
          auVar42._4_4_ = -(uint)(iVar30 < auVar16._4_4_);
          iVar58 = -(uint)(iVar53 < auVar16._8_4_);
          auVar42._12_4_ = -(uint)(iVar18 < auVar16._12_4_);
          auVar51._4_4_ = iVar54;
          auVar51._0_4_ = iVar54;
          auVar51._8_4_ = iVar58;
          auVar51._12_4_ = iVar58;
          auVar24 = pshuflw(auVar31,auVar51,0xe8);
          auVar29._0_4_ = -(uint)(auVar16._0_4_ == iVar44);
          auVar29._4_4_ = -(uint)(auVar16._4_4_ == iVar30);
          auVar29._8_4_ = -(uint)(auVar16._8_4_ == iVar53);
          auVar29._12_4_ = -(uint)(auVar16._12_4_ == iVar18);
          auVar41._4_4_ = auVar29._4_4_;
          auVar41._0_4_ = auVar29._4_4_;
          auVar41._8_4_ = auVar29._12_4_;
          auVar41._12_4_ = auVar29._12_4_;
          auVar16 = pshuflw(auVar29,auVar41,0xe8);
          auVar42._0_4_ = auVar42._4_4_;
          auVar42._8_4_ = auVar42._12_4_;
          auVar31 = pshuflw(auVar24,auVar42,0xe8);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          in_XMM11 = (auVar31 | auVar16 & auVar24) ^ auVar7;
          auVar16 = packssdw(auVar16 & auVar24,in_XMM11);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            psVar13[uVar12 - 3] = sVar1;
          }
          auVar42 = auVar41 & auVar51 | auVar42;
          auVar24 = packssdw(auVar42,auVar42);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar16 = packssdw(auVar16,auVar24 ^ auVar8);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16._12_2_ >> 8 & 1) != 0) {
            psVar13[uVar12 - 2] = sVar1;
          }
          auVar16 = auVar19 ^ auVar11;
          iVar44 = -(uint)(iVar44 < auVar16._0_4_);
          auVar52._4_4_ = -(uint)(iVar30 < auVar16._4_4_);
          iVar53 = -(uint)(iVar53 < auVar16._8_4_);
          auVar52._12_4_ = -(uint)(iVar18 < auVar16._12_4_);
          auVar43._4_4_ = iVar44;
          auVar43._0_4_ = iVar44;
          auVar43._8_4_ = iVar53;
          auVar43._12_4_ = iVar53;
          iVar44 = -(uint)(auVar16._4_4_ == iVar30);
          iVar30 = -(uint)(auVar16._12_4_ == iVar18);
          auVar17._4_4_ = iVar44;
          auVar17._0_4_ = iVar44;
          auVar17._8_4_ = iVar30;
          auVar17._12_4_ = iVar30;
          auVar52._0_4_ = auVar52._4_4_;
          auVar52._8_4_ = auVar52._12_4_;
          auVar16 = auVar17 & auVar43 | auVar52;
          auVar16 = packssdw(auVar16,auVar16);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar16 = packssdw(auVar16 ^ auVar9,auVar16 ^ auVar9);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            psVar13[uVar12 - 1] = sVar1;
          }
          auVar24 = pshufhw(auVar16,auVar43,0x84);
          auVar16 = pshufhw(auVar17,auVar17,0x84);
          auVar31 = pshufhw(auVar24,auVar52,0x84);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          in_XMM5 = (auVar31 | auVar16 & auVar24) ^ auVar10;
          auVar16 = packssdw(auVar16 & auVar24,in_XMM5);
          auVar16 = packsswb(auVar16,auVar16);
          if ((auVar16._14_2_ >> 8 & 1) != 0) {
            psVar13[uVar12] = sVar1;
          }
          uVar12 = uVar12 + 0x10;
          lVar20 = auVar61._8_8_;
          auVar61._0_8_ = auVar61._0_8_ + 0x10;
          auVar61._8_8_ = lVar20 + 0x10;
          lVar20 = auVar62._8_8_;
          auVar62._0_8_ = auVar62._0_8_ + 0x10;
          auVar62._8_8_ = lVar20 + 0x10;
          lVar20 = auVar63._8_8_;
          auVar63._0_8_ = auVar63._0_8_ + 0x10;
          auVar63._8_8_ = lVar20 + 0x10;
          lVar20 = auVar64._8_8_;
          auVar64._0_8_ = auVar64._0_8_ + 0x10;
          auVar64._8_8_ = lVar20 + 0x10;
          lVar20 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 0x10;
          auVar23._8_8_ = lVar20 + 0x10;
          lVar20 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 0x10;
          auVar22._8_8_ = lVar20 + 0x10;
          lVar20 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 0x10;
          auVar21._8_8_ = lVar20 + 0x10;
          lVar20 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 0x10;
          auVar19._8_8_ = lVar20 + 0x10;
        } while ((hs + 0xfU & 0xfffffff0) != uVar12);
      }
      uVar14 = uVar14 + 1;
      psVar13 = psVar13 + (uint)hs;
    } while (uVar14 != (uint)w);
  }
  return out;
}

Assistant:

static stbi_uc *stbi__resample_row_generic(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // resample with nearest-neighbor
   int i,j;
   STBI_NOTUSED(in_far);
   for (i=0; i < w; ++i)
      for (j=0; j < hs; ++j)
         out[i*hs+j] = in_near[i];
   return out;
}